

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::listTests
          (XmlReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
          IConfig *param_2)

{
  char *__s;
  bool bVar1;
  XmlWriter *pXVar2;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190 [32];
  undefined1 local_170 [8];
  ScopedElement sourceTag;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  TestCaseInfo *local_c8;
  TestCaseInfo *testInfo;
  string local_b8 [32];
  undefined1 local_98 [8];
  ScopedElement innerTag;
  TestCaseHandle *test;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *__range1;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  ScopedElement outerTag;
  IConfig *param_2_local;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests_local;
  XmlReporter *this_local;
  
  outerTag._8_8_ = param_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"MatchingTests",&local_51);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_30,(string *)&this->m_xml,(XmlFormatting)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  __end1 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin(tests);
  test = (TestCaseHandle *)
         std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::end(tests);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                      (&__end1,(__normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
                                *)&test);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    innerTag._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
         ::operator*(&__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_b8,"TestCase",(allocator<char> *)((long)&testInfo + 7));
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_98,(string *)&this->m_xml,(XmlFormatting)local_b8);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&testInfo + 7));
    local_c8 = TestCaseHandle::getTestCaseInfo((TestCaseHandle *)innerTag._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Name",&local_e9);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_e8,Indent);
    pXVar2 = XmlWriter::writeText(pXVar2,&local_c8->name,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"ClassName",&local_111);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_110,Indent);
    pXVar2 = XmlWriter::writeText(pXVar2,&local_c8->className,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Tags",&local_139);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_138,Indent);
    TestCaseInfo::tagsAsString_abi_cxx11_((string *)&sourceTag.m_fmt,local_c8);
    pXVar2 = XmlWriter::writeText(pXVar2,(string *)&sourceTag.m_fmt,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&sourceTag.m_fmt);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_190,"SourceInfo",&local_191);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_170,(string *)&this->m_xml,(XmlFormatting)local_190)
    ;
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"File",&local_1b9);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_1b8,Indent);
    __s = (local_c8->lineInfo).file;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,__s,&local_1e1);
    pXVar2 = XmlWriter::writeText(pXVar2,&local_1e0,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"Line",&local_209);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_208,Indent);
    std::__cxx11::to_string(&local_230,(local_c8->lineInfo).line);
    pXVar2 = XmlWriter::writeText(pXVar2,&local_230,None);
    XmlWriter::endElement(pXVar2,Newline);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_170);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_98);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
    ::operator++(&__end1);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_30);
  return;
}

Assistant:

void XmlReporter::listTests(std::vector<TestCaseHandle> const &tests, IConfig const &) {
        auto outerTag = m_xml.scopedElement("MatchingTests");
        for (auto const &test : tests) {
            auto innerTag = m_xml.scopedElement("TestCase");
            auto const &testInfo = test.getTestCaseInfo();
            m_xml.startElement("Name", XmlFormatting::Indent)
                .writeText(testInfo.name, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("ClassName", XmlFormatting::Indent)
                .writeText(testInfo.className, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Tags", XmlFormatting::Indent)
                .writeText(testInfo.tagsAsString(), XmlFormatting::None)
                .endElement(XmlFormatting::Newline);

            auto sourceTag = m_xml.scopedElement("SourceInfo");
            m_xml.startElement("File", XmlFormatting::Indent)
                .writeText(testInfo.lineInfo.file, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Line", XmlFormatting::Indent)
                .writeText(std::to_string(testInfo.lineInfo.line), XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
        }
    }